

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyRead.c
# Opt level: O1

Abc_TtStore_t * setTtStore(char *pFileInput)

{
  char cVar1;
  char *pcVar2;
  Abc_TtStore_t *pAVar3;
  word **ppwVar4;
  word *pwVar5;
  char *pcVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  byte bVar16;
  uint uVar17;
  
  pcVar2 = Abc_FileRead(pFileInput);
  iVar15 = 0;
  uVar17 = 0;
  if (pcVar2 == (char *)0x0) {
LAB_005633a4:
    pAVar3 = (Abc_TtStore_t *)malloc(0x18);
    pAVar3->nVars = iVar15;
    bVar7 = (char)iVar15 - 6;
    iVar10 = 1 << (bVar7 & 0x1f);
    if (iVar15 < 7) {
      iVar10 = 1;
    }
    pAVar3->nWords = iVar10;
    pAVar3->nFuncs = uVar17;
    bVar16 = 0;
    if (6 < iVar15) {
      bVar16 = bVar7;
    }
    ppwVar4 = (word **)malloc((long)(int)uVar17 * 8);
    pAVar3->pFuncs = ppwVar4;
    pwVar5 = (word *)calloc(8,(long)(int)(uVar17 << (bVar16 & 0x1f)));
    *ppwVar4 = pwVar5;
    if (1 < (int)uVar17) {
      pwVar5 = *ppwVar4;
      uVar12 = 1;
      do {
        pwVar5 = pwVar5 + iVar10;
        ppwVar4[uVar12] = pwVar5;
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
    }
    pcVar2 = Abc_FileRead(pFileInput);
    if (pcVar2 != (char *)0x0) {
      cVar1 = *pcVar2;
      lVar9 = 0;
      if (cVar1 != '\n') {
        uVar8 = 0x10 << (bVar7 & 0x1f);
        if (iVar15 < 7) {
          uVar8 = 1 << ((char)iVar15 - 2U & 0x1f);
        }
        lVar9 = 0;
        lVar11 = 0;
        pcVar6 = pcVar2;
        do {
          if (cVar1 == '0') {
            pcVar6 = pcVar6 + (ulong)(pcVar6[1] == 'x') * 2;
          }
          if ((0x20 < (ulong)(byte)pcVar6[(int)uVar8]) ||
             ((0x100002401U >> ((ulong)(byte)pcVar6[(int)uVar8] & 0x3f) & 1) == 0)) {
            __assert_fail("EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyRead.c"
                          ,0x45,"void Abc_TruthReadHex(word *, char *, int)");
          }
          if (0 < (int)uVar8) {
            pwVar5 = ppwVar4[lVar9];
            pcVar6 = pcVar6 + ((ulong)uVar8 - 1);
            lVar14 = 0;
            uVar13 = 0;
            do {
              cVar1 = *pcVar6;
              iVar15 = -0x30;
              if (((9 < (byte)(cVar1 - 0x30U)) && (iVar15 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
                 (iVar15 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyRead.c"
                              ,0x29,"int Abc_TruthReadHexDigit(char)");
              }
              pwVar5[uVar13 >> 4] =
                   pwVar5[uVar13 >> 4] | (ulong)(uint)(iVar15 + cVar1) << ((byte)lVar14 & 0x3c);
              uVar13 = uVar13 + 1;
              lVar14 = lVar14 + 4;
              pcVar6 = pcVar6 + -1;
            } while ((ulong)uVar8 * 4 - lVar14 != 0);
          }
          lVar9 = lVar9 + 1;
          lVar14 = lVar11 << 0x20;
          lVar11 = (long)(int)lVar11;
          do {
            pcVar6 = pcVar2 + lVar11;
            lVar11 = lVar11 + 1;
            lVar14 = lVar14 + 0x100000000;
          } while (*pcVar6 != '\n');
          pcVar6 = pcVar2 + (lVar14 >> 0x20);
          cVar1 = pcVar2[lVar14 >> 0x20];
        } while (cVar1 != '\n');
      }
      if ((int)uVar17 < (int)lVar9) {
        __assert_fail("p->nFuncs >= nLines",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyRead.c"
                      ,0xe8,"void Abc_TruthStoreRead(char *, Abc_TtStore_t *)");
      }
      pAVar3->nFuncs = (int)lVar9;
    }
    return pAVar3;
  }
  uVar12 = 0;
LAB_005632fd:
  bVar7 = pcVar2[uVar12];
  if (bVar7 < 0xd) {
    if (bVar7 == 0) {
      puts("Strange, the input file does not have spaces and new-lines...");
LAB_0056332d:
      cVar1 = *pcVar2;
      if (cVar1 == '0') {
        uVar8 = (uint)uVar12 - 2;
        if (pcVar2[1] != 'x') {
          uVar8 = (uint)uVar12;
        }
        uVar12 = (ulong)uVar8;
      }
      iVar15 = 0;
      do {
        if ((int)uVar12 << 2 == 1 << ((byte)iVar15 & 0x1f)) goto LAB_00563367;
        iVar15 = iVar15 + 1;
      } while (iVar15 != 0x20);
      iVar15 = 0x20;
LAB_00563367:
      if (iVar15 - 0x11U < 0xfffffff1) {
        puts("Does not look like the input file contains truth tables...");
        iVar15 = 0;
      }
      else if (cVar1 != '\0') {
        uVar17 = 0;
        do {
          pcVar2 = pcVar2 + 1;
          uVar17 = uVar17 + (cVar1 == '\n');
          cVar1 = *pcVar2;
        } while (cVar1 != '\0');
      }
      goto LAB_005633a4;
    }
    if (bVar7 == 10) goto LAB_0056332d;
  }
  else if ((bVar7 == 0xd) || (bVar7 == 0x20)) goto LAB_0056332d;
  uVar12 = uVar12 + 1;
  goto LAB_005632fd;
}

Assistant:

Abc_TtStore_t * setTtStore(char * pFileInput)
{
    int nVars, nTruths;
    Abc_TtStore_t * p;
    // figure out how many truth table and how many variables
    Abc_TruthGetParams( pFileInput, &nVars, &nTruths );
    // allocate data-structure
    p = Abc_TruthStoreAlloc( nVars, nTruths );

    Abc_TruthStoreRead( pFileInput, p );
    return p;
}